

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O2

fy_input * fy_node_get_input(fy_node *fyn)

{
  _Bool _Var1;
  fy_input *fyi;
  fy_input *pfVar2;
  
  fyi = fy_node_get_first_input(fyn);
  if (fyi == (fy_input *)0x0) {
    pfVar2 = (fy_input *)0x0;
  }
  else {
    _Var1 = fy_node_uses_single_input_only(fyn,fyi);
    pfVar2 = (fy_input *)0x0;
    if (_Var1) {
      pfVar2 = fyi;
    }
  }
  return pfVar2;
}

Assistant:

struct fy_input *fy_node_get_input(struct fy_node *fyn) {
    struct fy_input *fyi = NULL;

    fyi = fy_node_get_first_input(fyn);
    if (!fyi)
        return NULL;

    return fy_node_uses_single_input_only(fyn, fyi) ? fyi : NULL;
}